

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK4.cpp
# Opt level: O3

void __thiscall iDynTree::optimalcontrol::integrators::RK4::RK4(RK4 *this)

{
  SparseMatrix<double,_0,_int> *this_00;
  element_type *peVar1;
  Scalar *pSVar2;
  double *pdVar3;
  undefined8 *puVar4;
  
  FixedStepIntegrator::FixedStepIntegrator(&this->super_FixedStepIntegrator);
  (this->super_FixedStepIntegrator).super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__RK4_0019a3e8;
  this_00 = &this->m_aCoefficents;
  (this->m_aCoefficents).super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue = false;
  (this->m_aCoefficents).m_outerSize = -1;
  (this->m_aCoefficents).m_innerSize = 0;
  (this->m_aCoefficents).m_outerIndex = (StorageIndex *)0x0;
  (this->m_aCoefficents).m_innerNonZeros = (StorageIndex *)0x0;
  (this->m_aCoefficents).m_data.m_values = (Scalar *)0x0;
  (this->m_aCoefficents).m_data.m_indices = (StorageIndex *)0x0;
  (this->m_aCoefficents).m_data.m_size = 0;
  (this->m_aCoefficents).m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(this_00,0,0);
  (this->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->m_cCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->m_cCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->m_bCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->m_bCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  iDynTree::VectorDynSize::VectorDynSize(&this->m_computationBuffer);
  peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_infoData.
           super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar1->isExplicit = true;
  peVar1->numberOfStages = 4;
  std::__cxx11::string::_M_replace((ulong)peVar1,0,(char *)(peVar1->name)._M_string_length,0x184328)
  ;
  Eigen::SparseMatrix<double,_0,_int>::resize(this_00,4,4);
  Eigen::internal::CompressedStorage<double,_int>::reserve(&(this->m_aCoefficents).m_data,6);
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,1,0);
  *pSVar2 = 0.3333333333333333;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,2,0);
  *pSVar2 = -0.3333333333333333;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,2,1);
  *pSVar2 = 1.0;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,3,0);
  *pSVar2 = 1.0;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,3,1);
  *pSVar2 = -1.0;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,3,2);
  *pSVar2 = 1.0;
  pdVar3 = (this->m_bCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  if ((this->m_bCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows != 4) {
    free(pdVar3);
    pdVar3 = (double *)malloc(0x20);
    if (pdVar3 == (double *)0x0) goto LAB_00171225;
    (this->m_bCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
    .m_data = pdVar3;
  }
  (this->m_bCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 4;
  *pdVar3 = 0.125;
  pdVar3[1] = 0.375;
  pdVar3[2] = 0.375;
  pdVar3[3] = 0.125;
  pdVar3 = (this->m_cCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  if ((this->m_cCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows != 4) {
    free(pdVar3);
    pdVar3 = (double *)malloc(0x20);
    if (pdVar3 == (double *)0x0) {
LAB_00171225:
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = operator_new;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (this->m_cCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
    .m_data = pdVar3;
  }
  (this->m_cCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 4;
  *(undefined4 *)pdVar3 = 0;
  *(undefined4 *)((long)pdVar3 + 4) = 0;
  *(undefined4 *)(pdVar3 + 1) = 0x55555555;
  *(undefined4 *)((long)pdVar3 + 0xc) = 0x3fd55555;
  pdVar3[2] = 0.6666666666666666;
  pdVar3[3] = 1.0;
  return;
}

Assistant:

RK4::RK4()
            {
                m_infoData->isExplicit = true;
                m_infoData->numberOfStages = 4;
                m_infoData->name = "RK4";

                m_aCoefficents.resize(4,4);
                m_aCoefficents.reserve(6);
                m_aCoefficents.insert(1,0) =  1.0/3.0;
                m_aCoefficents.insert(2,0) = -1.0/3.0;
                m_aCoefficents.insert(2,1) =   1.0;
                m_aCoefficents.insert(3,0) =   1.0;
                m_aCoefficents.insert(3,1) =  -1.0;
                m_aCoefficents.insert(3,2) =   1.0;

                m_bCoefficients.resize(4);
                m_bCoefficients(0) = 1.0/8.0;
                m_bCoefficients(1) = 3.0/8.0;
                m_bCoefficients(2) = 3.0/8.0;
                m_bCoefficients(3) = 1.0/8.0;
                m_cCoefficients.resize(4);
                m_cCoefficients(0) = 0.0;
                m_cCoefficients(1) = 1.0/3.0;
                m_cCoefficients(2) = 2.0/3.0;
                m_cCoefficients(3) = 1.0;
            }